

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Probe.cpp
# Opt level: O3

void __thiscall helics::apps::Probe::runProbe(Probe *this)

{
  Endpoint *this_00;
  undefined8 *puVar1;
  element_type *peVar2;
  long lVar3;
  _func_int *p_Var4;
  bool bVar5;
  size_t __n;
  pointer *__ptr;
  unsigned_long_long uVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  undefined8 uVar7;
  string_view fmt;
  string_view message;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  Message *local_98;
  string local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  MessageFederate *pMStack_60;
  double local_58;
  byte *local_48;
  _Alloc_hider local_40;
  
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar3 = *(long *)(&(peVar2->super_ValueFederate).field_0x28 +
                   (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
  this_00 = &this->endpoint;
  bVar5 = Endpoint::hasMessage(this_00);
  uVar7 = (double)(lVar3 % 1000000000) * 1e-09 + (double)(lVar3 / 1000000000);
  if (bVar5) {
    local_70._M_allocated_capacity = uVar7;
    do {
      Endpoint::getMessage((Endpoint *)&local_98);
      peVar2 = (this->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var4 = (peVar2->super_ValueFederate)._vptr_ValueFederate[-3];
      local_40._M_p = (pointer)(local_98->data).bufferSize;
      local_48 = (local_98->data).heap;
      local_70._8_8_ = (local_98->source)._M_dataplus._M_p;
      pMStack_60 = (MessageFederate *)(local_98->source)._M_string_length;
      local_58 = (double)local_70._M_allocated_capacity;
      fmt.size_ = 0xdad;
      fmt.data_ = (char *)0x20;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)(local_70._M_local_buf + 8);
      ::fmt::v11::vformat_abi_cxx11_(&local_90,(v11 *)"Message from {} at Time {}: [{}]",fmt,args);
      message._M_str = local_90._M_dataplus._M_p;
      message._M_len = local_90._M_string_length;
      Federate::logMessage
                ((Federate *)
                 ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate + (long)p_Var4),6,message
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        (ulong)(local_90.field_2._M_allocated_capacity + 1));
      }
      this->messagesReceived = this->messagesReceived + 1;
      if (local_98 != (Message *)0x0) {
        std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)&local_98,local_98);
      }
      bVar5 = Endpoint::hasMessage(this_00);
      uVar7 = local_70._M_allocated_capacity;
    } while (bVar5);
  }
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar1 = (undefined8 *)
           (&(peVar2->super_ValueFederate).field_0x78 +
           (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
  local_70._8_8_ = *puVar1;
  pMStack_60 = (MessageFederate *)puVar1[1];
  uVar6 = (long)&local_70 + 8;
  fmt_00.size_ = 0xad;
  fmt_00.data_ = (char *)0x17;
  __n = 0xad;
  args_00.field_1.values_ = in_R9.values_;
  args_00.desc_ = uVar6;
  local_58 = (double)uVar7;
  ::fmt::v11::vformat_abi_cxx11_(&local_90,(v11 *)"message from {},time {}",fmt_00,args_00);
  Endpoint::send(this_00,(int)local_90._M_dataplus._M_p,(void *)local_90._M_string_length,__n,
                 (int)uVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,(ulong)(local_90.field_2._M_allocated_capacity + 1));
  }
  return;
}

Assistant:

void Probe::runProbe()
{
    auto ctime = fed->getCurrentTime();
    while (endpoint.hasMessage()) {
        auto message = endpoint.getMessage();
        fed->logInfoMessage(fmt::format("Message from {} at Time {}: [{}]",
                                        message->source,
                                        static_cast<double>(ctime),
                                        message->to_string()));
        ++messagesReceived;
    }
    endpoint.send(
        fmt::format("message from {},time {}", fed->getName(), static_cast<double>(ctime)));
}